

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

QRect __thiscall
QProxyStyle::itemTextRect
          (QProxyStyle *this,QFontMetrics *fm,QRect *r,int flags,bool enabled,QString *text)

{
  QRect QVar1;
  QStyle *pQVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QProxyStylePrivate *in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  QProxyStylePrivate *d;
  
  d_func((QProxyStyle *)0x409293);
  QProxyStylePrivate::ensureBaseStyle(in_RDI);
  pQVar2 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x4092b3);
  QVar1 = (QRect)(**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,in_RSI,in_RDX,in_ECX,in_R8B & 1,in_R9)
  ;
  return QVar1;
}

Assistant:

QRect QProxyStyle::itemTextRect(const QFontMetrics &fm, const QRect &r, int flags, bool enabled, const QString &text) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->itemTextRect(fm, r, flags, enabled, text);
}